

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_operators.hpp
# Opt level: O1

void __thiscall
duckdb::ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
          (ParquetUUIDOperator *this,ColumnWriterStatistics *stats_p,
          ParquetUUIDTargetType target_value)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ParquetUUIDTargetType target_value_local;
  
  uVar2 = target_value.bytes._0_8_;
  if (this[8] == (ParquetUUIDOperator)0x1) {
    uVar1 = (ulong)stats_p >> 0x38 | ((ulong)stats_p & 0xff000000000000) >> 0x28 |
            ((ulong)stats_p & 0xff0000000000) >> 0x18 | ((ulong)stats_p & 0xff00000000) >> 8 |
            ((ulong)stats_p & 0xff000000) << 8 | ((ulong)stats_p & 0xff0000) << 0x18 |
            ((ulong)stats_p & 0xff00) << 0x28 | (long)stats_p << 0x38;
    uVar3 = *(ulong *)(this + 9);
    uVar3 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
            (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
            (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    if (uVar1 == uVar3) {
      uVar3 = *(ulong *)(this + 0x11);
      uVar1 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18
              | (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18
              | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
      uVar3 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18
              | (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18
              | (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
      uVar4 = 0;
      if (uVar1 != uVar3) goto LAB_01d2220b;
    }
    else {
LAB_01d2220b:
      uVar4 = -(uint)(uVar1 < uVar3) | 1;
    }
    if ((int)uVar4 < 0) goto LAB_01d22219;
  }
  else {
LAB_01d22219:
    *(ColumnWriterStatistics **)(this + 9) = stats_p;
    *(ulong *)(this + 0x11) = uVar2;
  }
  if (this[8] != (ParquetUUIDOperator)0x0) {
    uVar1 = (ulong)stats_p >> 0x38 | ((ulong)stats_p & 0xff000000000000) >> 0x28 |
            ((ulong)stats_p & 0xff0000000000) >> 0x18 | ((ulong)stats_p & 0xff00000000) >> 8 |
            ((ulong)stats_p & 0xff000000) << 8 | ((ulong)stats_p & 0xff0000) << 0x18 |
            ((ulong)stats_p & 0xff00) << 0x28 | (long)stats_p << 0x38;
    uVar3 = *(ulong *)(this + 0x19);
    uVar3 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
            (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
            (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    if (uVar1 == uVar3) {
      uVar3 = *(ulong *)(this + 0x21);
      uVar1 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18
              | (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18
              | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
      uVar3 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18
              | (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18
              | (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
      uVar4 = 0;
      if (uVar1 != uVar3) goto LAB_01d22259;
    }
    else {
LAB_01d22259:
      uVar4 = -(uint)(uVar1 < uVar3) | 1;
    }
    if ((int)uVar4 < 1) goto LAB_01d22270;
  }
  *(ColumnWriterStatistics **)(this + 0x19) = stats_p;
  *(ulong *)(this + 0x21) = uVar2;
LAB_01d22270:
  this[8] = (ParquetUUIDOperator)0x1;
  return;
}

Assistant:

static void HandleStats(ColumnWriterStatistics *stats_p, TGT target_value) {
		auto &stats = stats_p->Cast<UUIDStatisticsState>();
		if (!stats.has_stats || memcmp(target_value.bytes, stats.min, ParquetUUIDTargetType::PARQUET_UUID_SIZE) < 0) {
			memcpy(stats.min, target_value.bytes, ParquetUUIDTargetType::PARQUET_UUID_SIZE);
		}
		if (!stats.has_stats || memcmp(target_value.bytes, stats.max, ParquetUUIDTargetType::PARQUET_UUID_SIZE) > 0) {
			memcpy(stats.max, target_value.bytes, ParquetUUIDTargetType::PARQUET_UUID_SIZE);
		}
		stats.has_stats = true;
	}